

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

void __thiscall
google::protobuf::io::OstreamOutputStream::OstreamOutputStream
          (OstreamOutputStream *this,ostream *output,int block_size)

{
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__OstreamOutputStream_0042c718;
  CopyingOstreamOutputStream::CopyingOstreamOutputStream(&this->copying_output_,output);
  CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
            (&this->impl_,&(this->copying_output_).super_CopyingOutputStream,block_size);
  return;
}

Assistant:

OstreamOutputStream::OstreamOutputStream(std::ostream* output, int block_size)
    : copying_output_(output), impl_(&copying_output_, block_size) {}